

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

void __thiscall Matrix::One(Matrix *this)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  auVar6 = _DAT_001512a0;
  auVar5 = _DAT_00151290;
  iVar1 = this->rowNo;
  if (0 < (long)iVar1) {
    uVar2 = this->colNo;
    ppdVar3 = this->array;
    lVar7 = (ulong)uVar2 - 1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar9 = auVar9 ^ _DAT_001512a0;
    do {
      if (0 < (int)uVar2) {
        pdVar4 = ppdVar3[lVar7];
        lVar8 = 0;
        auVar10 = auVar5;
        do {
          auVar12 = auVar10 ^ auVar6;
          if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                      auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar4 + lVar8) = 0x3ff0000000000000;
          }
          if (auVar12._12_4_ <= auVar9._12_4_ &&
              (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
            *(undefined8 *)((long)pdVar4 + lVar8 + 8) = 0x3ff0000000000000;
          }
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(uVar2 + 1 >> 1) << 4 != lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void Matrix::One()
{

    for (int i = 0; i < rowNo; i++)
    {
        for (int j = 0; j < colNo; j++)
        {
            array[i][j] = 1;
        }
    }

}